

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_cmac.cpp
# Opt level: O3

void ot::commissioner::otPbkdf2Cmac
               (uint8_t *aPassword,uint16_t aPasswordLen,uint8_t *aSalt,uint16_t aSaltLen,
               uint32_t aIterationCounter,uint16_t aKeyLen,uint8_t *aKey)

{
  uint8_t *puVar1;
  ushort uVar2;
  undefined6 in_register_0000000a;
  int iVar3;
  int iVar4;
  ulong key_length;
  long keyBlock [2];
  long prfOne [2];
  uint8_t prfInput [34];
  long prfTwo [2];
  ushort local_d4;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint8_t *local_b0;
  size_t local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uchar local_78 [48];
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_98 = CONCAT62(in_register_0000000a,aSaltLen) & 0xffffffff;
  memcpy(local_78,aSalt,local_98);
  if ((aIterationCounter & 1) == 0) {
    if (aKeyLen != 0) {
      local_b0 = aKey;
      local_a0 = (ulong)aSaltLen;
      key_length = (ulong)aPasswordLen;
      local_a8 = (size_t)(aSaltLen + 4);
      iVar3 = 0;
      local_d4 = aKeyLen;
      do {
        iVar3 = iVar3 + 1;
        local_78[local_98] = (uchar)((uint)iVar3 >> 0x18);
        local_78[local_a0 + 1] = (uchar)((uint)iVar3 >> 0x10);
        local_78[local_a0 + 2] = (uchar)((uint)iVar3 >> 8);
        local_78[local_a0 + 3] = (uchar)iVar3;
        mbedtls_aes_cmac_prf_128(aPassword,key_length,local_78,local_a8,(uchar *)&local_c8);
        mbedtls_aes_cmac_prf_128(aPassword,key_length,(uchar *)&local_c8,0x10,(uchar *)&local_88);
        local_c8 = local_c8 ^ local_88;
        uStack_c4 = uStack_c4 ^ uStack_84;
        uStack_c0 = uStack_c0 ^ uStack_80;
        uStack_bc = uStack_bc ^ uStack_7c;
        iVar4 = (aIterationCounter >> 1) - 1;
        if (2 < aIterationCounter) {
          do {
            mbedtls_aes_cmac_prf_128
                      (aPassword,key_length,(uchar *)&local_88,0x10,(uchar *)&local_48);
            mbedtls_aes_cmac_prf_128
                      (aPassword,key_length,(uchar *)&local_48,0x10,(uchar *)&local_88);
            local_c8 = local_48 ^ local_88 ^ local_c8;
            uStack_c4 = uStack_44 ^ uStack_84 ^ uStack_c4;
            uStack_c0 = uStack_40 ^ uStack_80 ^ uStack_c0;
            uStack_bc = uStack_3c ^ uStack_7c ^ uStack_bc;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        puVar1 = local_b0;
        uVar2 = 0x10;
        if (local_d4 < 0x10) {
          uVar2 = local_d4;
        }
        local_90 = (ulong)uVar2;
        memcpy(local_b0,&local_c8,local_90);
        local_b0 = puVar1 + local_90;
        local_d4 = local_d4 - (short)local_90;
      } while (local_d4 != 0);
    }
    return;
  }
  __assert_fail("aIterationCounter % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/pbkdf2_cmac.cpp"
                ,0x44,
                "void ot::commissioner::otPbkdf2Cmac(const uint8_t *, uint16_t, const uint8_t *, uint16_t, uint32_t, uint16_t, uint8_t *)"
               );
}

Assistant:

void otPbkdf2Cmac(const uint8_t *aPassword,
                  uint16_t       aPasswordLen,
                  const uint8_t *aSalt,
                  uint16_t       aSaltLen,
                  uint32_t       aIterationCounter,
                  uint16_t       aKeyLen,
                  uint8_t       *aKey)
{
    const size_t kBlockSize = MBEDTLS_CIPHER_BLKSIZE_MAX;
    uint8_t      prfInput[OT_PBKDF2_SALT_MAX_LEN + 4]; // Salt || INT(), for U1 calculation
    long         prfOne[kBlockSize / sizeof(long)];
    long         prfTwo[kBlockSize / sizeof(long)];
    long         keyBlock[kBlockSize / sizeof(long)];
    uint32_t     blockCounter = 0;
    uint8_t     *key          = aKey;
    uint16_t     keyLen       = aKeyLen;
    uint16_t     useLen       = 0;

    memcpy(prfInput, aSalt, aSaltLen);
    assert(aIterationCounter % 2 == 0);
    aIterationCounter /= 2;

    while (keyLen)
    {
        ++blockCounter;
        prfInput[aSaltLen + 0] = static_cast<uint8_t>(blockCounter >> 24);
        prfInput[aSaltLen + 1] = static_cast<uint8_t>(blockCounter >> 16);
        prfInput[aSaltLen + 2] = static_cast<uint8_t>(blockCounter >> 8);
        prfInput[aSaltLen + 3] = static_cast<uint8_t>(blockCounter);

        // Calculate U_1
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, prfInput, aSaltLen + 4,
                                 reinterpret_cast<uint8_t *>(keyBlock));

        // Calculate U_2
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(keyBlock), kBlockSize,
                                 reinterpret_cast<uint8_t *>(prfOne));

        for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
        {
            keyBlock[j] ^= prfOne[j];
        }

        for (uint32_t i = 1; i < aIterationCounter; ++i)
        {
            // Calculate U_{2 * i - 1}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfOne), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfTwo));
            // Calculate U_{2 * i}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfTwo), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfOne));

            for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
            {
                keyBlock[j] ^= prfOne[j] ^ prfTwo[j];
            }
        }

        useLen = (keyLen < kBlockSize) ? keyLen : kBlockSize;
        memcpy(key, keyBlock, useLen);
        key += useLen;
        keyLen -= useLen;
    }
}